

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuCreate.c
# Opt level: O3

void Fxu_CreateCoversNode
               (Fxu_Matrix *p,Fxu_Data_t *pData,int iNode,Fxu_Cube *pCubeFirst,Fxu_Cube *pCubeNext)

{
  Fxu_Cube **ppFVar1;
  Fxu_Var **ppFVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  uint *puVar6;
  void *__ptr;
  Fxu_Cube *pFVar7;
  char *pSop;
  Fxu_Lit *pFVar8;
  Fxu_Var **ppFVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  byte bVar13;
  Fxu_Var *pFVar14;
  
  ppFVar2 = &p->pOrderVars;
  p->ppTailVars = ppFVar2;
  p->pOrderVars = (Fxu_Var *)0x0;
  pFVar7 = pCubeFirst;
  ppFVar9 = ppFVar2;
  if (pCubeFirst == pCubeNext) {
    pFVar14 = (Fxu_Var *)0x0;
  }
  else {
    do {
      for (pFVar8 = (pFVar7->lLits).pHead; pFVar8 != (Fxu_Lit *)0x0; pFVar8 = pFVar8->pHNext) {
        iVar12 = pFVar8->pVar->iVar;
        pFVar14 = p->ppVars[(int)(iVar12 - (iVar12 >> 0x1f) | 1)];
        if (pFVar14->pOrder == (Fxu_Var *)0x0) {
          *ppFVar9 = pFVar14;
          ppFVar9 = &pFVar14->pOrder;
          p->ppTailVars = ppFVar9;
          pFVar14->pOrder = (Fxu_Var *)0x1;
        }
      }
      ppFVar1 = &pFVar7->pNext;
      pFVar7 = *ppFVar1;
    } while (*ppFVar1 != pCubeNext);
    pFVar14 = *ppFVar2;
  }
  puVar6 = (uint *)malloc(0x10);
  puVar6[0] = 0x10;
  puVar6[1] = 0;
  __ptr = malloc(0x40);
  *(void **)(puVar6 + 2) = __ptr;
  if ((Fxu_Var *)0x1 < pFVar14) {
    do {
      iVar12 = pFVar14->iVar;
      uVar11 = puVar6[1];
      if (uVar11 == *puVar6) {
        if ((int)uVar11 < 0x10) {
          if (__ptr == (void *)0x0) {
            __ptr = malloc(0x40);
          }
          else {
            __ptr = realloc(__ptr,0x40);
          }
          *(void **)(puVar6 + 2) = __ptr;
          uVar11 = 0x10;
          if (__ptr == (void *)0x0) {
LAB_004b9a63:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
        }
        else {
          if (__ptr == (void *)0x0) {
            __ptr = malloc((ulong)uVar11 * 8);
          }
          else {
            __ptr = realloc(__ptr,(ulong)uVar11 * 8);
          }
          *(void **)(puVar6 + 2) = __ptr;
          if (__ptr == (void *)0x0) goto LAB_004b9a63;
          uVar11 = uVar11 * 2;
        }
        *puVar6 = uVar11;
      }
      uVar11 = puVar6[1];
      puVar6[1] = uVar11 + 1;
      *(int *)((long)__ptr + (long)(int)uVar11 * 4) = iVar12 / 2;
      pFVar14 = pFVar14->pOrder;
    } while (pFVar14 != (Fxu_Var *)0x1);
  }
  Fxu_MatrixRingVarsUnmark(p);
  qsort(__ptr,(long)(int)puVar6[1],4,Vec_IntSortCompare1);
  uVar11 = puVar6[1];
  if (0 < (long)(int)uVar11) {
    ppFVar9 = p->ppVars;
    lVar4 = *(long *)(puVar6 + 2);
    lVar10 = 0;
    do {
      (ppFVar9[(long)*(int *)(lVar4 + lVar10 * 4) * 2]->lLits).nItems = (int)lVar10;
      (ppFVar9[(long)*(int *)(lVar4 + lVar10 * 4) * 2 + 1]->lLits).nItems = (int)lVar10;
      lVar10 = lVar10 + 1;
    } while ((int)uVar11 != lVar10);
  }
  iVar12 = 0;
  pFVar7 = pCubeFirst;
  if (pCubeFirst != pCubeNext) {
    do {
      iVar12 = (iVar12 + 1) - (uint)((pFVar7->lLits).nItems == 0);
      ppFVar1 = &pFVar7->pNext;
      pFVar7 = *ppFVar1;
    } while (*ppFVar1 != pCubeNext);
  }
  pSop = Abc_SopStart(pData->pManSop,iVar12,uVar11);
  if ((iNode < pData->nNodesOld) &&
     (iVar12 = Abc_SopGetPhase((char *)pData->vSops->pArray[iNode]), iVar12 == 0)) {
    Abc_SopComplement(pSop);
  }
  if (pCubeFirst == pCubeNext) {
    iVar12 = 0;
  }
  else {
    iVar12 = 0;
    do {
      if ((pCubeFirst->lLits).nItems != 0) {
        pFVar8 = (pCubeFirst->lLits).pHead;
        if (pFVar8 != (Fxu_Lit *)0x0) {
          do {
            iVar5 = (pFVar8->pVar->lLits).nItems;
            if ((int)uVar11 <= iVar5) {
              __assert_fail("iNum < vInputsNew->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuCreate.c"
                            ,0x186,
                            "void Fxu_CreateCoversNode(Fxu_Matrix *, Fxu_Data_t *, int, Fxu_Cube *, Fxu_Cube *)"
                           );
            }
            iVar3 = pFVar8->pVar->iVar;
            bVar13 = (byte)iVar3 & 1;
            if (iVar3 / 2 < pData->nNodesOld) {
              bVar13 = bVar13 ^ 0x31;
            }
            else {
              bVar13 = bVar13 | 0x30;
            }
            pSop[(long)iVar5 + (long)(int)((uVar11 + 3) * iVar12)] = bVar13;
            pFVar8 = pFVar8->pHNext;
          } while (pFVar8 != (Fxu_Lit *)0x0);
        }
        iVar12 = iVar12 + 1;
      }
      pCubeFirst = pCubeFirst->pNext;
    } while (pCubeFirst != pCubeNext);
  }
  iVar5 = Abc_SopGetCubeNum(pSop);
  if (iVar12 != iVar5) {
    __assert_fail("nCubes == Abc_SopGetCubeNum(pSopCover)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuCreate.c"
                  ,399,
                  "void Fxu_CreateCoversNode(Fxu_Matrix *, Fxu_Data_t *, int, Fxu_Cube *, Fxu_Cube *)"
                 );
  }
  pData->vSopsNew->pArray[iNode] = pSop;
  pData->vFaninsNew->pArray[iNode] = puVar6;
  return;
}

Assistant:

void Fxu_CreateCoversNode( Fxu_Matrix * p, Fxu_Data_t * pData, int iNode, Fxu_Cube * pCubeFirst, Fxu_Cube * pCubeNext )
{
    Vec_Int_t * vInputsNew;
    char * pSopCover, * pSopCube;
    Fxu_Var * pVar;
    Fxu_Cube * pCube;
    Fxu_Lit * pLit;
    int iNum, nCubes, v;

    // collect positive polarity variable in the cubes between pCubeFirst and pCubeNext
    Fxu_MatrixRingVarsStart( p );
    for ( pCube = pCubeFirst; pCube != pCubeNext; pCube = pCube->pNext )
        for ( pLit = pCube->lLits.pHead; pLit; pLit = pLit->pHNext )
        {
            pVar = p->ppVars[ 2 * (pLit->pVar->iVar/2) + 1 ];
            if ( pVar->pOrder == NULL )
                Fxu_MatrixRingVarsAdd( p, pVar );
        }
    Fxu_MatrixRingVarsStop( p );

    // collect the variable numbers
    vInputsNew = Vec_IntAlloc( 4 );
    Fxu_MatrixForEachVarInRing( p, pVar )
        Vec_IntPush( vInputsNew, pVar->iVar / 2 );
    Fxu_MatrixRingVarsUnmark( p );

    // sort the vars by their number
    Vec_IntSort( vInputsNew, 0 );

    // mark the vars with their numbers in the sorted array
    for ( v = 0; v < vInputsNew->nSize; v++ )
    {
        p->ppVars[ 2 * vInputsNew->pArray[v] + 0 ]->lLits.nItems = v; // hack - reuse lLits.nItems
        p->ppVars[ 2 * vInputsNew->pArray[v] + 1 ]->lLits.nItems = v; // hack - reuse lLits.nItems
    }

    // count the number of cubes
    nCubes = 0;
    for ( pCube = pCubeFirst; pCube != pCubeNext; pCube = pCube->pNext )
        if ( pCube->lLits.nItems )
            nCubes++;

    // allocate room for the new cover
    pSopCover = Abc_SopStart( pData->pManSop, nCubes, vInputsNew->nSize );
    // set the correct polarity of the cover
    if ( iNode < pData->nNodesOld && Abc_SopGetPhase( (char *)pData->vSops->pArray[iNode] ) == 0 )
        Abc_SopComplement( pSopCover );

    // add the cubes
    nCubes = 0;
    for ( pCube = pCubeFirst; pCube != pCubeNext; pCube = pCube->pNext )
    {
        if ( pCube->lLits.nItems == 0 )
            continue;
        // get hold of the SOP cube
        pSopCube = pSopCover + nCubes * (vInputsNew->nSize + 3);
        // insert literals
        for ( pLit = pCube->lLits.pHead; pLit; pLit = pLit->pHNext )
        {
            iNum = pLit->pVar->lLits.nItems; // hack - reuse lLits.nItems
            assert( iNum < vInputsNew->nSize );
            if ( pLit->pVar->iVar / 2 < pData->nNodesOld )
                pSopCube[iNum] = (pLit->pVar->iVar & 1)? '0' : '1';   // reverse CST
            else
                pSopCube[iNum] = (pLit->pVar->iVar & 1)? '1' : '0';   // no CST
        }
        // count the cube
        nCubes++;
    }
    assert( nCubes == Abc_SopGetCubeNum(pSopCover) );

    // set the new cover and the array of fanins
    pData->vSopsNew->pArray[iNode]   = pSopCover;
    pData->vFaninsNew->pArray[iNode] = vInputsNew;
}